

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O3

StatusOr<bool> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetBool
          (UnparseProto3Type *this,Field f,Msg *msg,size_t idx)

{
  uint uVar1;
  bool bVar2;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 aVar3;
  pointer prVar4;
  LogMessage *this_00;
  size_t sVar5;
  ulong uVar6;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 this_01;
  UntypedMessage *this_02;
  long lVar7;
  int32_t field_number;
  ulong uVar8;
  UntypedMessage *pUVar9;
  Span<const_google::protobuf::json_internal::UntypedMessage::Bool> SVar10;
  StatusOr<bool> SVar11;
  Span<const_int> SVar12;
  StatusOr<bool> SVar13;
  Span<const_google::protobuf::json_internal::UntypedMessage> SVar14;
  StatusOr<bool> SVar15;
  StatusOr<bool> SVar16;
  int32_t iStack_7c;
  iterator iStack_78;
  int32_t iStack_64;
  iterator iStack_60;
  undefined8 uStack_50;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 aStack_40;
  code *pcStack_38;
  UnparseProto3Type *pUStack_28;
  code *pcStack_20;
  
  uVar1 = (f->raw_->field_0)._impl_.number_;
  uVar6 = (ulong)uVar1;
  pcStack_20 = (code *)0x2d3b43;
  sVar5 = idx;
  SVar10 = UntypedMessage::Get<google::protobuf::json_internal::UntypedMessage::Bool>(msg,uVar1);
  SVar11.super_StatusOrData<bool>._8_8_ = SVar10.len_;
  if (idx < SVar11.super_StatusOrData<bool>._8_8_) {
    this[8] = (UnparseProto3Type)(SVar10.ptr_[idx] == kTrue);
    *(undefined8 *)this = 1;
    SVar11.super_StatusOrData<bool>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)this
    ;
    return (StatusOr<bool>)SVar11.super_StatusOrData<bool>;
  }
  pcStack_20 = GetEnumValue;
  GetBool();
  uVar1 = *(uint *)(*(long *)(uVar6 + 8) + 0x50);
  uVar8 = (ulong)uVar1;
  pcStack_38 = (code *)0x2d3b81;
  uVar6 = sVar5;
  aVar3 = this_01;
  pUStack_28 = this;
  pcStack_20 = (code *)idx;
  SVar12 = UntypedMessage::Get<int>((UntypedMessage *)this_01,uVar1);
  SVar13.super_StatusOrData<bool>._8_8_ = SVar12.len_;
  if (sVar5 < SVar13.super_StatusOrData<bool>._8_8_) {
    *(int *)&(((flat_hash_map<_183d73f4_> *)((long)msg + 8))->super_raw_hash_map<_2385b75b_>).
             super_raw_hash_set<_2385b75b_>.settings_.
             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
             capacity_ = SVar12.ptr_[sVar5];
    msg->desc_ = 1;
    SVar13.super_StatusOrData<bool>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)msg;
    return (StatusOr<bool>)SVar13.super_StatusOrData<bool>;
  }
  pcStack_38 = GetMessage;
  GetEnumValue();
  field_number = *(int32_t *)(*(long *)(uVar8 + 8) + 0x50);
  uStack_50 = 0x2d3bbd;
  pUVar9 = this_02;
  aStack_40 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)msg;
  pcStack_38 = (code *)sVar5;
  SVar14 = UntypedMessage::Get<google::protobuf::json_internal::UntypedMessage>
                     (this_02,field_number);
  SVar15.super_StatusOrData<bool>._8_8_ = SVar14.len_;
  if (uVar6 < SVar15.super_StatusOrData<bool>._8_8_) {
    (((flat_hash_map<_183d73f4_> *)((long)aVar3 + 8))->super_raw_hash_map<_2385b75b_>).
    super_raw_hash_set<_2385b75b_>.settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = (size_t)(SVar14.ptr_ + uVar6);
    *(undefined8 *)aVar3 = 1;
    SVar15.super_StatusOrData<bool>.field_0 = aVar3;
    return (StatusOr<bool>)SVar15.super_StatusOrData<bool>;
  }
  uStack_50 = 0x2d3be5;
  GetMessage();
  iStack_7c = field_number;
  iStack_60 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::find<int>
                        ((raw_hash_set<_2385b75b_> *)&pUVar9->fields_,&iStack_7c);
  iStack_78.ctrl_ = (ctrl_t *)0x0;
  bVar2 = absl::lts_20240722::container_internal::operator==(&iStack_60,&iStack_78);
  lVar7 = 0;
  aVar3 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)0x0;
  if (!bVar2) {
    prVar4 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::iterator::operator->
                       (&iStack_60);
    if (*(__index_type *)
         ((long)&(prVar4->second).
                 super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                 .
                 super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
         + 0x28) == '\x05') {
      aVar3 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)&prVar4->second;
      lVar7 = 1;
    }
    else {
      prVar4 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::iterator::
               operator->(&iStack_60);
      if (*(__index_type *)
           ((long)&(prVar4->second).
                   super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                   .
                   super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
           + 0x28) != '\x0e') {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&iStack_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/json/internal/untyped_message.h"
                   ,0xc9,5,"false");
        absl::lts_20240722::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                  (&iStack_78,0x23,"wrong type for UntypedMessage::Get(");
        iStack_64 = iStack_7c;
        this_00 = (LogMessage *)
                  _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                            (&iStack_78);
        absl::lts_20240722::log_internal::LogMessage::operator<<(this_00,(char (*) [2])0x37a3cb);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&iStack_78);
      }
      aVar3 = *(anon_union_8_1_1246618d_for_StatusOrData<bool>_1 *)
               &(prVar4->second).
                super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                .
                super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                .
                super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                .
                super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                .
                super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                .
                super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
      ;
      lVar7 = *(long *)((long)&(prVar4->second).
                               super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                               .
                               super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                               .
                               super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                               .
                               super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                               .
                               super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                               .
                               super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                       + 8) - (long)aVar3 >> 2;
    }
  }
  SVar16.super_StatusOrData<bool>._8_8_ = lVar7;
  SVar16.super_StatusOrData<bool>.field_0 = aVar3;
  return (StatusOr<bool>)SVar16.super_StatusOrData<bool>;
}

Assistant:

static absl::StatusOr<bool> GetBool(Field f, const Msg& msg, size_t idx = 0) {
    return msg.Get<Msg::Bool>(f->proto().number())[idx] == Msg::kTrue;
  }